

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

void __thiscall
QToolBarAreaLayoutInfo::insertToolBarBreak(QToolBarAreaLayoutInfo *this,QToolBar *before)

{
  Data *pDVar1;
  pointer pQVar2;
  QToolBar *pQVar3;
  long lVar4;
  ulong pos;
  ulong uVar5;
  QList<QToolBarAreaLayoutItem> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QToolBarAreaLayoutItem> local_88;
  QToolBarAreaLayoutLine local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->lines).d.size;
  if (before == (QToolBar *)0x0) {
    if ((lVar4 == 0) || ((this->lines).d.ptr[lVar4 + -1].toolBarItems.d.size != 0)) {
      local_68.rect.x1.m_i = 0;
      local_68.rect.y1.m_i = 0;
      local_68.rect.x2.m_i = -1;
      local_68.rect.y2.m_i = -1;
      local_68.o = this->o;
      local_68.toolBarItems.d.d = (Data *)0x0;
      local_68.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
      local_68.toolBarItems.d.size = 0;
      QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine>
                ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this,lVar4,&local_68);
      QList<QToolBarAreaLayoutLine>::end(&this->lines);
LAB_004b7d6e:
      if (&(local_68.toolBarItems.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_68.toolBarItems.d.d)->super_QArrayData,0x18,0x10);
        }
      }
    }
  }
  else if (lVar4 != 0) {
    uVar5 = 0;
    do {
      pQVar2 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
      if (pQVar2[uVar5].toolBarItems.d.size != 0) {
        this_00 = &pQVar2[uVar5].toolBarItems;
        lVar4 = 0;
        pos = 0;
        do {
          pQVar3 = (QToolBar *)
                   (**(code **)(**(long **)((long)&(pQVar2[uVar5].toolBarItems.d.ptr)->widgetItem +
                                           lVar4) + 0x68))();
          if (pQVar3 == before) {
            if (lVar4 == 0) goto LAB_004b7d8c;
            local_68.rect.x1.m_i = 0;
            local_68.rect.y1.m_i = 0;
            local_68.rect.x2.m_i = -1;
            local_68.rect.y2.m_i = -1;
            local_68._20_4_ = 0xaaaaaaaa;
            local_68.o = this->o;
            local_68.toolBarItems.d.d = (Data *)0x0;
            local_68.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
            local_68.toolBarItems.d.size = 0;
            QList<QToolBarAreaLayoutItem>::mid
                      ((QList<QToolBarAreaLayoutItem> *)&local_88,this_00,pos,-1);
            pDVar1 = local_68.toolBarItems.d.d;
            local_68.toolBarItems.d.size = local_88.size;
            local_68.toolBarItems.d.ptr = local_88.ptr;
            local_68.toolBarItems.d.d = local_88.d;
            local_88.size = 0;
            local_88.d = (Data *)0x0;
            local_88.ptr = (QToolBarAreaLayoutItem *)0x0;
            if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar1->super_QArrayData,0x18,0x10);
              }
            }
            if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_88.d)->super_QArrayData,0x18,0x10);
              }
            }
            QList<QToolBarAreaLayoutItem>::mid
                      ((QList<QToolBarAreaLayoutItem> *)&local_88,this_00,0,pos);
            QArrayDataPointer<QToolBarAreaLayoutItem>::operator=(&this_00->d,&local_88);
            if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_88.d)->super_QArrayData,0x18,0x10);
              }
            }
            QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::
            emplace<QToolBarAreaLayoutLine_const&>
                      ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this,(ulong)((int)uVar5 + 1),
                       &local_68);
            QList<QToolBarAreaLayoutLine>::begin(&this->lines);
            goto LAB_004b7d6e;
          }
          pos = pos + 1;
          lVar4 = lVar4 + 0x18;
        } while (pos < (ulong)pQVar2[uVar5].toolBarItems.d.size);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(this->lines).d.size);
  }
LAB_004b7d8c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::insertToolBarBreak(QToolBar *before)
{
    if (before == nullptr) {
        if (!lines.isEmpty() && lines.constLast().toolBarItems.isEmpty())
            return;
        lines.append(QToolBarAreaLayoutLine(o));
        return;
    }

    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            if (line.toolBarItems.at(k).widgetItem->widget() == before) {
                if (k == 0)
                    return;

                QToolBarAreaLayoutLine newLine(o);
                newLine.toolBarItems = line.toolBarItems.mid(k);
                line.toolBarItems = line.toolBarItems.mid(0, k);
                lines.insert(j + 1, newLine);

                return;
            }
        }
    }
}